

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_glsl.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  code *ctx;
  int local_20;
  int local_1c;
  int i;
  int version_major;
  char **argv_local;
  int argc_local;
  
  local_1c = 2;
  for (local_20 = 1; local_20 < argc; local_20 = local_20 + 1) {
    local_1c = atoi(argv[local_20]);
  }
  glfwInit();
  glfwWindowHint(0x20004,0);
  glfwWindowHint(0x2200b,0x36002);
  glfwWindowHint(0x22001,0x30002);
  glfwWindowHint(0x22002,local_1c);
  window = glfwCreateWindow(0xfa,0xfa,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (window == (GLFWwindow *)0x0) {
    argv_local._4_4_ = 0x7d;
  }
  else {
    glfwMakeContextCurrent(window);
    ctx = glfwGetProcAddress;
    iVar1 = gladLoadGLES2Loader(glfwGetProcAddress);
    if (iVar1 == 0) {
      argv_local._4_4_ = 1;
    }
    else {
      init((EVP_PKEY_CTX *)ctx);
      reshape();
      draw();
      glfwDestroyWindow(window);
      glfwTerminate();
      argv_local._4_4_ = 0;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char *argv[])
{
    int version_major = 2;

    int i;

    for (i = 1; i < argc; ++i) {
         version_major = atoi(argv[i]);
    }

    glfwInit();

    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);
    glfwWindowHint(GLFW_CONTEXT_CREATION_API, GLFW_EGL_CONTEXT_API);
    glfwWindowHint(GLFW_CLIENT_API, GLFW_OPENGL_ES_API);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, version_major);

    window = glfwCreateWindow(250, 250, argv[0], NULL, NULL);
    if (!window) {
        return EXIT_SKIP;
    }

    glfwMakeContextCurrent(window);

    if (!gladLoadGLES2Loader((GLADloadproc)glfwGetProcAddress)) {
        return EXIT_FAILURE;
    }

    init();
    reshape();
    draw();

    glfwDestroyWindow(window);
    glfwTerminate();

    return 0;
}